

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Ivy_ManCutTruthOne(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vTruth,int nWords)

{
  int *piVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  piVar1 = vTruth->pArray;
  iVar3 = pNode->TravId << 3;
  iVar5 = *(int *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 4) << 3;
  pIVar2 = pNode->pFanin1;
  iVar6 = *(int *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 4) << 3;
  uVar7 = 0;
  if ((*(uint *)&pNode->field_0x8 & 0xf) == 6) {
    uVar4 = (ulong)(uint)nWords;
    if (nWords < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      piVar1[(long)iVar3 + uVar7] = piVar1[(long)iVar6 + uVar7] ^ piVar1[(long)iVar5 + uVar7];
    }
  }
  else {
    if (0 < nWords) {
      uVar7 = (ulong)(uint)nWords;
    }
    uVar4 = 0;
    if (((ulong)pNode->pFanin0 & 1) == 0) {
      if (((ulong)pIVar2 & 1) == 0) {
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          piVar1[(long)iVar3 + uVar4] = piVar1[(long)iVar6 + uVar4] & piVar1[(long)iVar5 + uVar4];
        }
      }
      else {
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          piVar1[(long)iVar3 + uVar4] = ~piVar1[(long)iVar6 + uVar4] & piVar1[(long)iVar5 + uVar4];
        }
      }
    }
    else if (((ulong)pIVar2 & 1) == 0) {
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        piVar1[(long)iVar3 + uVar4] = ~piVar1[(long)iVar5 + uVar4] & piVar1[(long)iVar6 + uVar4];
      }
    }
    else {
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        piVar1[(long)iVar3 + uVar4] = ~(piVar1[(long)iVar6 + uVar4] | piVar1[(long)iVar5 + uVar4]);
      }
    }
  }
  return;
}

Assistant:

static inline int * Vec_IntArray( Vec_Int_t * p )
{
    return p->pArray;
}